

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  EnumValueDescriptor *pEVar9;
  string *psVar10;
  uint uVar11;
  AlphaNum *extraout_RDX;
  AlphaNum *extraout_RDX_00;
  AlphaNum *extraout_RDX_01;
  AlphaNum *extraout_RDX_02;
  AlphaNum *a;
  AlphaNum *in_R8;
  string_view src;
  string_view src_00;
  AlphaNum local_d0;
  string local_a0;
  AlphaNum local_80;
  AlphaNum local_50;
  
  if ((this->field_0x1 & 1) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc0a,"has_default_value()");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d0,(char (*) [17])"No default value");
    goto LAB_0012f3c2;
  }
  uVar11 = *(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4) - 1;
  if (9 < uVar11) {
switchD_0012f18d_default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc2a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d0,
               (char (*) [54])"Can\'t get here: failed to get default value as string");
LAB_0012f3c2:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d0);
  }
  src_00._M_str =
       (char *)((long)&switchD_0012f18d::switchdataD_0029ab20 +
               (long)(int)(&switchD_0012f18d::switchdataD_0029ab20)[uVar11]);
  switch(*(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4)) {
  case 1:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,(this->field_20).default_value_int32_t_);
    a = extraout_RDX;
    break;
  case 2:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,(this->field_20).default_value_int64_t_);
    a = extraout_RDX_02;
    break;
  case 3:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,(this->field_20).default_value_uint32_t_);
    a = extraout_RDX_00;
    break;
  case 4:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,(this->field_20).default_value_uint64_t_);
    a = extraout_RDX_01;
    break;
  case 5:
    io::SimpleDtoa_abi_cxx11_
              (__return_storage_ptr__,(io *)&switchD_0012f18d::switchdataD_0029ab20,
               (this->field_20).default_value_double_);
    return __return_storage_ptr__;
  case 6:
    io::SimpleFtoa_abi_cxx11_
              (__return_storage_ptr__,(io *)&switchD_0012f18d::switchdataD_0029ab20,
               (this->field_20).default_value_float_);
    return __return_storage_ptr__;
  case 7:
    src_00._M_str = "false";
    if ((this->field_20).default_value_bool_ != false) {
      src_00._M_str = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,src_00._M_str,(allocator<char> *)&local_d0);
    return __return_storage_ptr__;
  case 8:
    pEVar9 = default_value_enum(this);
    psVar10 = pEVar9->all_names_;
    goto LAB_0012f1e4;
  case 9:
    if (quote_string_type) {
      local_d0.piece_ = absl::lts_20250127::NullSafeStringView("\"");
      pEVar9 = (this->field_20).default_value_enum_;
      uVar1 = pEVar9->super_SymbolBaseN<0>;
      uVar3 = pEVar9->super_SymbolBaseN<1>;
      uVar5 = *(undefined2 *)&pEVar9->field_0x2;
      uVar7 = pEVar9->number_;
      src._M_len._4_4_ = uVar7;
      src._M_len._2_2_ = uVar5;
      src._M_len._1_1_ = uVar3;
      src._M_len._0_1_ = uVar1;
      src._M_str = src_00._M_str;
      absl::lts_20250127::CEscape_abi_cxx11_(&local_a0,(lts_20250127 *)pEVar9->all_names_,src);
      local_80.piece_._M_len = local_a0._M_string_length;
      local_80.piece_._M_str = local_a0._M_dataplus._M_p;
      local_50.piece_ = absl::lts_20250127::NullSafeStringView("\"");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_d0,&local_80,&local_50,in_R8);
      std::__cxx11::string::~string((string *)&local_a0);
      return __return_storage_ptr__;
    }
    if (this->type_ == 0xc) {
      pEVar9 = (this->field_20).default_value_enum_;
      uVar2 = pEVar9->super_SymbolBaseN<0>;
      uVar4 = pEVar9->super_SymbolBaseN<1>;
      uVar6 = *(undefined2 *)&pEVar9->field_0x2;
      uVar8 = pEVar9->number_;
      src_00._M_len._4_4_ = uVar8;
      src_00._M_len._2_2_ = uVar6;
      src_00._M_len._1_1_ = uVar4;
      src_00._M_len._0_1_ = uVar2;
      absl::lts_20250127::CEscape_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)pEVar9->all_names_,src_00);
      return __return_storage_ptr__;
    }
    psVar10 = (this->field_20).default_value_string_;
LAB_0012f1e4:
    local_d0.piece_._M_str = (psVar10->_M_dataplus)._M_p;
    local_d0.piece_._M_len = psVar10->_M_string_length;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_d0.piece_,(allocator<char> *)&local_80);
    return __return_storage_ptr__;
  case 10:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc27);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d0,(char (*) [36])"Messages can\'t have default values!");
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_d0);
    goto switchD_0012f18d_default;
  }
  absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_d0,a);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  ABSL_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return absl::StrCat(default_value_int32_t());
    case CPPTYPE_INT64:
      return absl::StrCat(default_value_int64_t());
    case CPPTYPE_UINT32:
      return absl::StrCat(default_value_uint32_t());
    case CPPTYPE_UINT64:
      return absl::StrCat(default_value_uint64_t());
    case CPPTYPE_FLOAT:
      return io::SimpleFtoa(default_value_float());
    case CPPTYPE_DOUBLE:
      return io::SimpleDtoa(default_value_double());
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return absl::StrCat("\"", absl::CEscape(default_value_string()), "\"");
      } else {
        if (type() == TYPE_BYTES) {
          return absl::CEscape(default_value_string());
        } else {
          return std::string(default_value_string());
        }
      }
    case CPPTYPE_ENUM:
      return std::string(default_value_enum()->name());
    case CPPTYPE_MESSAGE:
      ABSL_DLOG(FATAL) << "Messages can't have default values!";
      break;
  }
  ABSL_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}